

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.cpp
# Opt level: O0

void __thiscall ANTLRException::ANTLRException(ANTLRException *this,string *s)

{
  string *in_RSI;
  exception *in_RDI;
  
  std::exception::exception(in_RDI);
  *(undefined ***)in_RDI = &PTR__ANTLRException_0036c658;
  std::__cxx11::string::string((string *)(in_RDI + 8),in_RSI);
  return;
}

Assistant:

ANTLRException::ANTLRException(const std::string& s)
: text(s)
{}